

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libmeshb7.c
# Opt level: O1

int GmfGetBlock(int64_t MshIdx,int KwdCod,int64_t BegIdx,int64_t EndIdx,int MapTyp,void *MapTab,
               void *prc,...)

{
  __jmp_buf_tag *__env;
  long lVar1;
  ulong uVar2;
  undefined1 uVar3;
  int iVar4;
  char in_AL;
  int iVar5;
  long lVar6;
  long lVar7;
  double *__ptr;
  ulong uVar8;
  double dVar9;
  ulong uVar10;
  char *pcVar11;
  uint *puVar12;
  int iVar13;
  uint uVar14;
  ulong uVar15;
  code *pcVar16;
  long lVar17;
  uint uVar18;
  double *pdVar19;
  void *pvVar20;
  uint uVar21;
  ulong uVar22;
  uint uVar23;
  ulong uVar24;
  ulong uVar25;
  long lVar26;
  double *pdVar27;
  double *pdVar28;
  bool bVar29;
  undefined4 in_XMM0_Da;
  float fVar30;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  code *in_stack_00000010;
  aiocb aio;
  int UsrTyp [1000];
  size_t UsrLen [1000];
  char *UsrDat [1000];
  int FilTyp [1000];
  char *UsrBas [1000];
  uint *local_7f30;
  aiocb local_7e88;
  ulong local_7e58;
  long local_7e50;
  ulong local_7e48;
  long local_7e40;
  ulong local_7e38;
  long local_7e30;
  uint *local_7e28;
  long local_7e20;
  ulong local_7e18;
  uint *local_7e10;
  double *local_7e08;
  double *local_7e00;
  ulong local_7df8;
  ulong local_7df0;
  uint local_7de8 [12];
  undefined4 local_7db8;
  undefined8 local_7da8;
  undefined8 local_7d98;
  undefined8 local_7d88;
  undefined8 local_7d78;
  undefined8 local_7d68;
  undefined8 local_7d58;
  undefined8 local_7d48;
  int aiStack_7d38 [1000];
  long alStack_6d98 [1000];
  long alStack_4e58 [1000];
  uint auStack_2f18 [1000];
  long alStack_1f78 [1001];
  
  if (in_AL != '\0') {
    local_7db8 = in_XMM0_Da;
    local_7da8 = in_XMM1_Qa;
    local_7d98 = in_XMM2_Qa;
    local_7d88 = in_XMM3_Qa;
    local_7d78 = in_XMM4_Qa;
    local_7d68 = in_XMM5_Qa;
    local_7d58 = in_XMM6_Qa;
    local_7d48 = in_XMM7_Qa;
  }
  __env = (__jmp_buf_tag *)(MshIdx + 0x48);
  iVar5 = _setjmp(__env);
  local_7e38 = 0;
  uVar15 = 0;
  if ((0xffffff0f < KwdCod - 0xf1U) && (iVar5 == 0)) {
    lVar1 = MshIdx + (long)KwdCod * 0x3300;
    if ((*(ulong *)(lVar1 + 0x10d8) != 0) &&
       (((local_7e38 = uVar15, (*(uint *)(lVar1 + 0x110) & 0xfffffffe) == 2 &&
         (local_7df0 = BegIdx - 1, local_7df0 < (ulong)EndIdx)) &&
        ((ulong)EndIdx <= *(ulong *)(lVar1 + 0x10d8))))) {
      if (MapTyp == 10) {
        pvVar20 = MapTab;
        MapTab = (void *)0x0;
      }
      else {
        pvVar20 = (void *)0x0;
        if (MapTyp != 0xb) {
          pvVar20 = (void *)0x0;
          MapTab = (void *)0x0;
        }
      }
      local_7f30 = (uint *)&stack0x00000010;
      if (prc == (void *)0x0) {
        prc = (code *)0x0;
        pcVar16 = (code *)prc;
        local_7e10 = (uint *)EndIdx;
      }
      else {
        local_7f30 = (uint *)&stack0x00000018;
        pcVar16 = in_stack_00000010;
        local_7e10 = local_7f30;
      }
      if ((*(uint *)(lVar1 + 0x110) & 0xfffffffe) != 2) {
        longjmp(__env,-0x24);
      }
      lVar17 = EndIdx - BegIdx;
      uVar23 = *local_7f30;
      local_7e28 = local_7f30;
      local_7e20 = lVar17;
      local_7e18 = local_7df0;
      puVar12 = local_7f30 + 2;
      if (uVar23 == 100) {
        local_7e28 = *(uint **)(local_7f30 + 2);
        local_7e20 = *(long *)(local_7f30 + 4);
        local_7e10 = *(uint **)(local_7f30 + 6);
        local_7e18 = *(ulong *)(local_7f30 + 8);
        puVar12 = local_7f30 + 10;
      }
      local_7f30 = puVar12;
      uVar18 = 0x30;
      lVar6 = lVar17 + 1;
      uVar14 = *(uint *)(lVar1 + 0x11c);
      if (0 < (int)uVar14) {
        bVar29 = true;
        iVar13 = 0;
        uVar15 = (ulong)uVar23;
        iVar5 = iVar13;
        do {
          if (uVar23 == 100) {
            lVar7 = (long)iVar5;
            uVar14 = local_7e28[lVar7];
            uVar15 = (ulong)uVar14;
            if ((uVar14 & 0xfffffffc) == 0xc) {
              uVar15 = (ulong)(uVar14 - 4);
              uVar21 = *(uint *)(local_7e20 + lVar7 * 4);
            }
            else {
              uVar21 = 1;
              if (uVar14 - 1 < 4) {
                uVar21 = *(uint *)(MshIdx + 0x1c + uVar15 * 4);
                uVar15 = (ulong)(*(int *)(MshIdx + 4) == 1 ^ 9);
              }
            }
            lVar26 = *(long *)(local_7e10 + lVar7 * 2);
            puVar12 = (uint *)(local_7e18 + lVar7 * 8);
            iVar5 = iVar5 + 1;
          }
          else {
            if (!bVar29) {
              uVar15 = (ulong)uVar18;
              if (uVar15 < 0x29) {
                uVar18 = uVar18 + 8;
                puVar12 = (uint *)((long)local_7de8 + uVar15);
              }
              else {
                puVar12 = local_7f30;
                local_7f30 = local_7f30 + 2;
              }
              uVar15 = (ulong)*puVar12;
            }
            uVar14 = (uint)uVar15;
            if ((uVar14 & 0xfffffffc) == 0xc) {
              uVar15 = (ulong)uVar18;
              if (uVar15 < 0x29) {
                uVar18 = uVar18 + 8;
                puVar12 = (uint *)((long)local_7de8 + uVar15);
              }
              else {
                puVar12 = local_7f30;
                local_7f30 = local_7f30 + 2;
              }
              uVar14 = uVar14 - 4;
              uVar21 = *puVar12;
            }
            else {
              uVar21 = 1;
              if (uVar14 - 1 < 4) {
                uVar21 = *(uint *)(MshIdx + 0x1c + uVar15 * 4);
                uVar14 = *(int *)(MshIdx + 4) == 1 ^ 9;
              }
            }
            uVar15 = (ulong)uVar14;
            uVar24 = (ulong)uVar18;
            if (uVar24 < 0x29) {
              uVar18 = uVar18 + 8;
              puVar12 = (uint *)((long)local_7de8 + uVar24);
            }
            else {
              puVar12 = local_7f30;
              local_7f30 = local_7f30 + 2;
            }
            lVar26 = *(long *)puVar12;
            uVar24 = (ulong)uVar18;
            if (uVar24 < 0x29) {
              uVar18 = uVar18 + 8;
              puVar12 = (uint *)((long)local_7de8 + uVar24);
            }
            else {
              puVar12 = local_7f30;
              local_7f30 = local_7f30 + 2;
            }
            bVar29 = false;
          }
          if (lVar6 < 2) {
            lVar7 = 0;
          }
          else {
            lVar7 = (*(long *)puVar12 - lVar26) / lVar17;
          }
          if (0 < (int)uVar21) {
            iVar4 = *(int *)(&DAT_0010fa30 + (long)(int)uVar15 * 4);
            uVar24 = 0;
            do {
              aiStack_7d38[(long)iVar13 + uVar24] = (int)uVar15;
              alStack_1f78[(long)iVar13 + uVar24] = lVar26;
              alStack_4e58[(long)iVar13 + uVar24] = lVar26;
              alStack_6d98[(long)iVar13 + uVar24] = lVar7;
              uVar24 = uVar24 + 1;
              lVar26 = lVar26 + iVar4;
            } while (uVar21 != uVar24);
            iVar13 = iVar13 + (int)uVar24;
          }
          uVar14 = *(uint *)(lVar1 + 0x11c);
        } while (iVar13 < (int)uVar14);
      }
      if ((int)uVar14 < 1) {
        uVar15 = 0;
      }
      else {
        uVar24 = 0;
        uVar15 = uVar24;
        do {
          if (*(char *)(lVar1 + 0x10e8 + uVar24) == 'r') {
            uVar23 = *(int *)(MshIdx + 0x18) == 0x20 ^ 9;
          }
          else {
            uVar23 = *(int *)(MshIdx + 4) < 4 ^ 0xb;
          }
          auStack_2f18[uVar24] = uVar23;
          uVar15 = uVar15 + (long)*(int *)(&DAT_0010fa50 + (ulong)(uVar23 - 8) * 4);
          uVar24 = uVar24 + 1;
        } while (uVar14 != uVar24);
      }
      fseek(*(FILE **)(MshIdx + 0x300410),*(long *)(lVar1 + 0x10e0),0);
      if ((*(byte *)(MshIdx + 0xc) & 1) == 0) {
        __ptr = (double *)malloc(uVar15 * 10000);
        if (__ptr == (double *)0x0) {
          longjmp(__env,-0x25);
        }
        local_7e08 = (double *)malloc(uVar15 * 10000);
        if (local_7e08 == (double *)0x0) {
          longjmp(__env,-0x26);
        }
        local_7e88.aio_nbytes = 0;
        local_7e88.aio_offset = 0;
        local_7e88.aio_lio_opcode = 0;
        local_7e88._36_4_ = 0;
        local_7e88.aio_fildes = *(FILE **)(MshIdx + 0x300410);
        local_7e88.aio_buf = __ptr;
        local_7e00 = local_7e08;
        lVar17 = ftell((FILE *)local_7e88.aio_fildes);
        local_7e88.aio_offset = local_7df0 * uVar15 + lVar17;
        lVar26 = -(lVar6 >> 0x3f);
        lVar17 = lVar6 / 10000 + (lVar6 >> 0x3f);
        uVar2 = lVar17 + lVar26;
        uVar8 = lVar17 + lVar26 + 1;
        uVar25 = 0;
        uVar24 = uVar25;
        pdVar19 = __ptr;
        uVar22 = uVar25;
        local_7df8 = uVar15;
        do {
          if (uVar25 != 0) {
            if (local_7e88.aio_lio_opcode != 0) {
              if (local_7e88.aio_lio_opcode == 0x73) {
                do {
                } while( true );
              }
              pcVar11 = strerror(local_7e88.aio_lio_opcode);
              printf(" Error at aio_error() : %s\n",pcVar11);
              longjmp(__env,-0x27);
            }
            local_7e88.aio_offset = local_7e88.aio_offset + local_7e88.aio_nbytes;
            bVar29 = (double *)local_7e88.aio_buf == __ptr;
            pdVar19 = local_7e08;
            local_7e88.aio_buf = __ptr;
            if (bVar29) {
              pdVar19 = __ptr;
              local_7e88.aio_buf = local_7e08;
            }
          }
          if (uVar25 <= uVar2) {
            local_7e50 = uVar25 * -10000 + lVar6;
            if (uVar25 != uVar2) {
              local_7e50 = 10000;
            }
            local_7e88.aio_nbytes = local_7e50 * local_7df8;
            local_7e48 = uVar24;
            iVar5 = my_aio_read(&local_7e88);
            uVar24 = local_7e48;
            if (iVar5 == -1) {
              printf("block      = %zd / %zd\n",uVar25 + 1,uVar8);
              printf("size       = %ld lines\n",local_7e50);
              printf("aio_fildes = %p\n",local_7e88.aio_fildes);
              printf("aio_buf    = %p\n",local_7e88.aio_buf);
              printf("aio_offset = %ld\n",local_7e88.aio_offset);
              printf("aio_nbytes = %ld\n",local_7e88.aio_nbytes);
              puVar12 = (uint *)__errno_location();
              printf("errno      = %d\n",(ulong)*puVar12);
              longjmp(__env,-0x29);
            }
          }
          uVar15 = uVar22;
          if (uVar25 != 0) {
            lVar17 = (uVar25 - 1) * -10000 + lVar6;
            if (uVar25 - 1 != uVar2) {
              lVar17 = 10000;
            }
            if (0 < lVar17) {
              lVar26 = 0;
              uVar15 = uVar24;
              pdVar27 = pdVar19;
              do {
                local_7e30 = lVar26;
                uVar24 = uVar15 + 1;
                if (0 < *(int *)(lVar1 + 0x11c)) {
                  uVar10 = 0;
                  do {
                    if (*(int *)(MshIdx + 0x10) != 1) {
                      uVar23 = *(uint *)(&DAT_0010fa30 + (long)(int)auStack_2f18[uVar10] * 4);
                      lVar26 = (ulong)uVar23 - 1;
                      lVar7 = 0;
                      pdVar28 = pdVar27;
                      do {
                        uVar3 = *(undefined1 *)((long)pdVar27 + lVar7 + lVar26);
                        *(undefined1 *)((long)pdVar27 + lVar7 + lVar26) = *(undefined1 *)pdVar28;
                        *(undefined1 *)pdVar28 = uVar3;
                        lVar7 = lVar7 + -1;
                        pdVar28 = (double *)((long)pdVar28 + 1);
                      } while (-lVar7 != (ulong)(uVar23 >> 1));
                    }
                    iVar5 = (int)uVar10;
                    if ((*(long *)(lVar1 + 0x10c8) != 0) && (uVar10 != *(int *)(lVar1 + 0x11c) - 1))
                    {
                      iVar5 = *(int *)(*(long *)(lVar1 + 0x10c8) + uVar10 * 4);
                    }
                    if (pvVar20 == (void *)0x0) {
                      if (MapTab != (void *)0x0) {
                        lVar26 = *(long *)((long)MapTab + uVar24 * 8);
                        goto LAB_0010cc28;
                      }
                      lVar26 = alStack_6d98[iVar5] * uVar15;
                    }
                    else {
                      lVar26 = (long)*(int *)((long)pvVar20 + uVar24 * 4);
LAB_0010cc28:
                      lVar26 = (lVar26 + -1) * alStack_6d98[iVar5];
                    }
                    alStack_4e58[uVar10] = alStack_1f78[iVar5] + lVar26;
                    uVar23 = auStack_2f18[uVar10];
                    switch(uVar23) {
                    case 8:
                      pdVar28 = (double *)alStack_4e58[uVar10];
                      fVar30 = *(float *)pdVar27;
                      if (aiStack_7d38[uVar10] != 8) {
                        dVar9 = (double)fVar30;
                        goto LAB_0010ccc6;
                      }
LAB_0010cce7:
                      *(float *)pdVar28 = fVar30;
                      break;
                    case 9:
                      pdVar28 = (double *)alStack_4e58[uVar10];
                      dVar9 = *pdVar27;
                      if (aiStack_7d38[uVar10] != 9) {
                        fVar30 = (float)dVar9;
                        goto LAB_0010cce7;
                      }
LAB_0010ccc6:
                      *pdVar28 = dVar9;
                      break;
                    case 10:
                      pdVar28 = (double *)alStack_4e58[uVar10];
                      dVar9 = (double)(ulong)(uint)*(float *)pdVar27;
                      if (aiStack_7d38[uVar10] != 10) {
                        dVar9 = (double)(long)(int)*(float *)pdVar27;
                        goto LAB_0010ccaa;
                      }
LAB_0010ccde:
                      *(int *)pdVar28 = SUB84(dVar9,0);
                      break;
                    case 0xb:
                      pdVar28 = (double *)alStack_4e58[uVar10];
                      dVar9 = *pdVar27;
                      if (aiStack_7d38[uVar10] != 0xb) goto LAB_0010ccde;
LAB_0010ccaa:
                      *pdVar28 = dVar9;
                    }
                    pdVar27 = (double *)
                              ((long)pdVar27 + (long)*(int *)(&DAT_0010fa30 + (long)(int)uVar23 * 4)
                              );
                    uVar10 = uVar10 + 1;
                  } while ((long)uVar10 < (long)*(int *)(lVar1 + 0x11c));
                }
                lVar26 = local_7e30 + 1;
                uVar15 = uVar24;
              } while (local_7e30 + 1 != lVar17);
            }
            uVar15 = lVar17 + uVar22;
            if ((code *)prc != (code *)0x0) {
              local_7e58 = uVar24;
              (*(code *)prc)(uVar22 + 1,uVar15,pcVar16);
              uVar24 = local_7e58;
            }
          }
          uVar25 = uVar25 + 1;
          uVar22 = uVar15;
        } while (uVar25 <= uVar8);
        free(__ptr);
        free(local_7e00);
      }
      else {
        local_7e38 = 1;
        if (EndIdx == 0) goto LAB_0010cf07;
        lVar17 = 1;
        do {
          iVar5 = *(int *)(lVar1 + 0x11c);
          if (0 < iVar5) {
            local_7e40 = lVar17 + -1;
            uVar15 = 0;
            do {
              if ((*(long *)(lVar1 + 0x10c8) == 0) || (uVar15 == iVar5 - 1)) {
                iVar5 = (int)uVar15;
              }
              else {
                iVar5 = *(int *)(*(long *)(lVar1 + 0x10c8) + uVar15 * 4);
              }
              if (pvVar20 == (void *)0x0) {
                if (MapTab != (void *)0x0) {
                  lVar6 = *(long *)((long)MapTab + lVar17 * 8);
                  goto LAB_0010ce46;
                }
                lVar6 = alStack_6d98[iVar5] * local_7e40;
              }
              else {
                lVar6 = (long)*(int *)((long)pvVar20 + lVar17 * 4);
LAB_0010ce46:
                lVar6 = (lVar6 + -1) * alStack_6d98[iVar5];
              }
              alStack_4e58[uVar15] = lVar6 + alStack_1f78[iVar5];
              iVar5 = __isoc99_fscanf(*(undefined8 *)(MshIdx + 0x300410),
                                      &DAT_0010fb50 + (int)(&UINT_0010fb30)[aiStack_7d38[uVar15]]);
              if (iVar5 != 1) {
                longjmp(__env,-1);
              }
              uVar15 = uVar15 + 1;
              iVar5 = *(int *)(lVar1 + 0x11c);
            } while ((long)uVar15 < (long)iVar5);
          }
          uVar15 = local_7e38;
          lVar17 = (lVar17 + 1) - (ulong)(local_7e38 < (ulong)BegIdx);
          if ((code *)prc != (code *)0x0) {
            (*(code *)prc)(1,*(undefined8 *)(lVar1 + 0x10d8),pcVar16);
          }
          local_7e38 = uVar15 + 1;
        } while (local_7e38 <= (ulong)EndIdx);
      }
      local_7e38 = 1;
    }
  }
LAB_0010cf07:
  return (int)local_7e38;
}

Assistant:

int GmfGetBlock(  int64_t MshIdx, int KwdCod, int64_t BegIdx, int64_t EndIdx,
                  int MapTyp, void *MapTab, void *prc, ... )
{
   char        *UsrDat[ GmfMaxTyp ], *UsrBas[ GmfMaxTyp ], *FilPos, *EndUsrDat;
   char        *FilBuf = NULL, *FrtBuf = NULL, *BckBuf = NULL, *BegUsrDat;
   char        *StrTab[4] = { "%f", "%lf", "%d", INT64_T_FMT };
   char        **BegTab, **EndTab;
   int         i, j, k, *FilPtrI32, *UsrPtrI32, FilTyp[ GmfMaxTyp ];
   int         UsrTyp[ GmfMaxTyp ], TypSiz[4] = {4,8,4,8};
   int         *IntMapTab = NULL, err, TotSiz = 0, IniFlg = 1, mod = GmfArgLst;
   int         *TypTab, *SizTab, typ, VecCnt, ArgCnt = 0;
   float       *FilPtrR32, *UsrPtrR32;
   double      *FilPtrR64, *UsrPtrR64;
   int64_t     BlkNmbLin, *FilPtrI64, *UsrPtrI64, BlkBegIdx, BlkEndIdx = 0;
   int64_t     *LngMapTab = NULL, OldIdx = 0, UsrNmbLin, VecLen;
   size_t      FilBegIdx = BegIdx, FilEndIdx = EndIdx;
   void        (*UsrPrc)(int64_t, int64_t, void *) = NULL;
   size_t      UsrLen[ GmfMaxTyp ], ret, LinSiz, b, l, NmbBlk;
   va_list     VarArg;
   GmfMshSct   *msh = (GmfMshSct *)MshIdx;
   KwdSct      *kwd = &msh->KwdTab[ KwdCod ];
   struct      aiocb aio;
   char        *UsrArg = NULL;

   // Save the current stack environment for longjmp
   if( (err = setjmp(msh->err)) != 0)
   {
#ifdef GMFDEBUG
      printf("libMeshb : mesh %p : error %d\n", msh, err);
#endif
      if(BckBuf)
         free(BckBuf);

      if(FrtBuf)
         free(FrtBuf);

      return(0);
   }

   // Check mesh and keyword
   if( (KwdCod < 1) || (KwdCod > GmfMaxKwd) || !kwd->NmbLin )
      return(0);

   // Make sure it's not a simple information keyword
   if( (kwd->typ != RegKwd) && (kwd->typ != SolKwd) )
      return(0);

   // Check user's bounds
   if( (FilBegIdx < 1) || (FilBegIdx > FilEndIdx) || (FilEndIdx > (size_t)kwd->NmbLin) )
      return(0);

   // Compute the number of lines to be read
   UsrNmbLin = FilEndIdx - FilBegIdx + 1;

   // Get the renumbering map if any
   if(MapTyp == GmfInt)
      IntMapTab = (int *)MapTab;
   else if(MapTyp == GmfLong)
      LngMapTab = (int64_t *)MapTab;

   // Start decoding the arguments
   va_start(VarArg, prc);
   LinSiz = 0;

   // Get the user's preprocessing procedure and argument adresses, if any
   if(prc)
   {
      UsrPrc = (void (*)(int64_t, int64_t, void *))prc;
      UsrArg = va_arg(VarArg, void *);
   }

   if( (kwd->typ != RegKwd) && (kwd->typ != SolKwd) )
      longjmp(msh->err, -36);

   // Read the first data type to select between list and table mode
   typ = va_arg(VarArg, int);

   // If the table mode is selected, read the four additional tables
   // containing the arguments: type, vector size, begin and end pointers
   if(typ == GmfArgTab)
   {
      mod = GmfArgTab;
      TypTab = va_arg(VarArg, int *);
      SizTab = va_arg(VarArg, int *);
      BegTab = va_arg(VarArg, char **);
      EndTab = va_arg(VarArg, char **);
   }

   // Read the arguments until to total size reaches the keyword's size
   while(TotSiz < kwd->SolSiz)
   {
      // In list mode all arguments are read from the variable argument buffer
      if(mod == GmfArgLst)
      {
         // Do not read the type argument for the first iteration because
         // it was read befeore the loop begins to get the argument mode
         if(IniFlg)
            IniFlg = 0;
         else
            typ = va_arg(VarArg, int);

         if(typ >= GmfFloatVec && typ <= GmfLongVec)
         {
            // In case the type is a vector, get its size and change
            // the type for the corresponding scalar type
            typ -= 4;
            VecCnt = va_arg(VarArg, int);
         }
         else if(typ >= GmfSca && typ <= GmfMat)
         {
            // In case it is a mathematical solution, expand it
            // to the right size with the mesh file's own real kind
            VecCnt = msh->SolTypSiz[ typ ];
            typ = (msh->ver == 1) ? GmfFloat : GmfDouble;
         }
         else
            VecCnt = 1;

         BegUsrDat = va_arg(VarArg, char *);
         EndUsrDat = va_arg(VarArg, char *);
      }
      else
      {
         // Do exactly the same as above but the arguments are read from
         // the tables instead of VarArgs
         typ = TypTab[ ArgCnt ];

         if(typ >= GmfFloatVec && typ <= GmfLongVec)
         {
            typ -= 4;
            VecCnt = SizTab[ ArgCnt ];
         }
         else if(typ >= GmfSca && typ <= GmfMat)
         {
            // In case it is a mathematical solution, expand it
            //  to the right size with the mesh file's own real kind
            VecCnt = msh->SolTypSiz[ typ ];
            typ = (msh->ver == 1) ? GmfFloat : GmfDouble;
         }
         else
            VecCnt = 1;

         BegUsrDat = (char *)BegTab[ ArgCnt ];
         EndUsrDat = (char *)EndTab[ ArgCnt ];
         ArgCnt++;
      }

      if(UsrNmbLin > 1)
      {
         VecLen = (size_t)(EndUsrDat - BegUsrDat);
         VecLen /= UsrNmbLin - 1;
      }
      else
         VecLen = 0;

      // Compute the consecutive begin / end adresses for vector data types
      for(i=0;i<VecCnt;i++)
      {
         UsrTyp[ TotSiz ]  = typ;
         UsrBas[ TotSiz ]  = BegUsrDat + i * TypSiz[ typ - GmfFloat ];
         UsrDat[ TotSiz ]  = UsrBas[ TotSiz ];
         UsrLen[ TotSiz ]  = VecLen;
         TotSiz++;
      }
   }

   // Get the file's data type
   for(i=0;i<kwd->SolSiz;i++)
   {
      if(kwd->fmt[i] == 'r')
         if(msh->FltSiz == 32)
            FilTyp[i] = GmfFloat;
         else
            FilTyp[i] = GmfDouble;
      else
         if(msh->ver <= 3)
            FilTyp[i] = GmfInt;
         else
            FilTyp[i] = GmfLong;

      // Compute the file stride
      LinSiz += TypSiz[ FilTyp[i] - GmfFloat ];
   }

   va_end(VarArg);

   // Move file pointer to the keyword data
   SetFilPos(msh, kwd->pos);

   // Read the whole kwd data
   if(msh->typ & Asc)
   {
      OldIdx = 1;

      for(l=1;l<=FilEndIdx;l++)
      {
         for(j=0;j<kwd->SolSiz;j++)
         {
            // Reorder HO nodes on the fly
            if(kwd->OrdTab && (j != kwd->SolSiz-1))
               k = kwd->OrdTab[j];
            else
               k = j;

            // Move to the next user's data line only when the desired
            // begining position in the ascii file has been reached since
            // we cannot move directly to an arbitrary position
            if(IntMapTab)
               UsrDat[j] = UsrBas[k] + (IntMapTab[ OldIdx ] - 1) * UsrLen[k];
            else if(LngMapTab)
               UsrDat[j] = UsrBas[k] + (LngMapTab[ OldIdx ] - 1) * UsrLen[k];
            else
               UsrDat[j] = UsrBas[k] + (OldIdx - 1) * UsrLen[k];

            safe_fscanf(msh->hdl, StrTab[ UsrTyp[j] - GmfFloat ], UsrDat[j], msh->err);
         }

         if(l >= FilBegIdx)
            OldIdx++;

         // Call the user's preprocessing procedure
         if(UsrPrc)
            UsrPrc(1, kwd->NmbLin, UsrArg);
      }
   }
   else
   {
      // Allocate both front and back buffers
      if(!(BckBuf = malloc(BufSiz * LinSiz)))
         longjmp(msh->err, -37);

      if(!(FrtBuf = malloc(BufSiz * LinSiz)))
         longjmp(msh->err, -38);

      // Setup the ansynchonous parameters
      memset(&aio, 0, sizeof(struct aiocb));
      FilBuf = BckBuf;
      aio.aio_buf = BckBuf;
#ifdef WITH_GMF_AIO
      aio.aio_fildes = msh->FilDes;
#else
      aio.aio_fildes = msh->hdl;
#endif
      aio.aio_offset = (size_t)(GetFilPos(msh) + (FilBegIdx-1) * LinSiz);

      NmbBlk = UsrNmbLin / BufSiz;

      // Loop over N+1 blocks
      for(b=0;b<=NmbBlk+1;b++)
      {
         // Wait for the previous block read to complete except
         // for the first loop interation
         if(b)
         {
            while(my_aio_error(&aio) == EINPROGRESS);

            err = my_aio_error(&aio);
            ret = my_aio_return(&aio);

            if (err != 0) {
              printf (" Error at aio_error() : %s\n", strerror (err));
              longjmp(msh->err, -39);
            }

            if (ret != aio.aio_nbytes) {
              printf(" Error at aio_return()\n");
              longjmp(msh->err, -40);
            }

            // Increment the reading position
            aio.aio_offset += (size_t)aio.aio_nbytes;

            // and swap the buffers
            if(aio.aio_buf == BckBuf)
            {
               aio.aio_buf = FrtBuf;
               FilBuf = BckBuf;
            }
            else
            {
               aio.aio_buf = BckBuf;
               FilBuf = FrtBuf;
            }
         }
 
         // Read a chunk of data except for the last loop interarion
         if(b <= NmbBlk)
         {
            // The last block is shorter than the others
            if(b == NmbBlk)
               BlkNmbLin = UsrNmbLin - b * BufSiz;
            else
               BlkNmbLin = BufSiz;

            aio.aio_nbytes = BlkNmbLin * LinSiz;

            if(my_aio_read(&aio) == -1)
            {
               printf("block      = %zd / %zd\n", b+1, NmbBlk+1);
               printf("size       = "INT64_T_FMT" lines\n", BlkNmbLin);
#ifdef WITH_GMF_AIO
               printf("aio_fildes = %d\n",aio.aio_fildes);
#else
               printf("aio_fildes = %p\n",aio.aio_fildes);
#endif
               printf("aio_buf    = %p\n",aio.aio_buf);
               printf("aio_offset = " INT64_T_FMT "\n",(int64_t)aio.aio_offset);
               printf("aio_nbytes = " INT64_T_FMT "\n",(int64_t)aio.aio_nbytes);
               printf("errno      = %d\n",errno);
               longjmp(msh->err, -41);
            }
         }

         // Then decode the block and store it in the user's data structure
         // except for the first loop interation
         if(b)
         {
            // The last block is shorter than the others
            if(b-1 == NmbBlk)
               BlkNmbLin = UsrNmbLin - (b-1) * BufSiz;
            else
               BlkNmbLin = BufSiz;

            BlkBegIdx = BlkEndIdx+1;
            BlkEndIdx += BlkNmbLin;
            FilPos = FilBuf;

            for(i=0;i<BlkNmbLin;i++)
            {
               OldIdx++;

               for(j=0;j<kwd->SolSiz;j++)
               {
                  if(msh->cod != 1)
                     SwpWrd(FilPos, TypSiz[ FilTyp[j] - GmfFloat ]);

                  // Reorder HO nodes on the fly
                  if(kwd->OrdTab && (j != kwd->SolSiz-1))
                     k = kwd->OrdTab[j];
                  else
                     k = j;

                  if(IntMapTab)
                     UsrDat[j] = UsrBas[k] + (IntMapTab[ OldIdx ] - 1) * UsrLen[k];
                  else if(LngMapTab)
                     UsrDat[j] = UsrBas[k] + (LngMapTab[ OldIdx ] - 1) * UsrLen[k];
                  else
                     UsrDat[j] = UsrBas[k] + (OldIdx - 1) * UsrLen[k];

                  if(FilTyp[j] == GmfInt)
                  {
                     FilPtrI32 = (int *)FilPos;

                     if(UsrTyp[j] == GmfInt)
                     {
                        UsrPtrI32 = (int *)UsrDat[j];
                        *UsrPtrI32 = *FilPtrI32;
                     }
                     else
                     {
                        UsrPtrI64 = (int64_t *)UsrDat[j];
                        *UsrPtrI64 = (int64_t)*FilPtrI32;
                     }
                  }
                  else if(FilTyp[j] == GmfLong)
                  {
                     FilPtrI64 = (int64_t *)FilPos;

                     if(UsrTyp[j] == GmfLong)
                     {
                        UsrPtrI64 = (int64_t *)UsrDat[j];
                        *UsrPtrI64 = *FilPtrI64;
                     }
                     else
                     {
                        UsrPtrI32 = (int *)UsrDat[j];
                        *UsrPtrI32 = (int)*FilPtrI64;
                     }
                  }
                  else if(FilTyp[j] == GmfFloat)
                  {
                     FilPtrR32 = (float *)FilPos;

                     if(UsrTyp[j] == GmfFloat)
                     {
                        UsrPtrR32 = (float *)UsrDat[j];
                        *UsrPtrR32 = *FilPtrR32;
                     }
                     else
                     {
                        UsrPtrR64 = (double *)UsrDat[j];
                        *UsrPtrR64 = (double)*FilPtrR32;
                     }
                  }
                  else if(FilTyp[j] == GmfDouble)
                  {
                     FilPtrR64 = (double *)FilPos;

                     if(UsrTyp[j] == GmfDouble)
                     {
                        UsrPtrR64 = (double *)UsrDat[j];
                        *UsrPtrR64 = *FilPtrR64;
                     }
                     else
                     {
                        UsrPtrR32 = (float *)UsrDat[j];
                        *UsrPtrR32 = (float)*FilPtrR64;
                     }
                  }

                  FilPos += TypSiz[ FilTyp[j] - GmfFloat ];
               }
            }

            // Call the user's preprocessing procedure
            if(UsrPrc)
               UsrPrc(BlkBegIdx, BlkEndIdx, UsrArg);
         }
      }

      free(BckBuf);
      free(FrtBuf);
   }

   return(1);
}